

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O3

Result * CoreML::validateFeatureDescriptions<CoreML::Specification::ModelDescription>
                   (Result *__return_storage_ptr__,ModelDescription *interface,int modelVersion,
                   ValidationPolicy *validationPolicy)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  int iVar3;
  Rep *pRVar4;
  pointer pcVar5;
  uint uVar6;
  bool bVar7;
  int iVar8;
  long *plVar9;
  undefined8 *puVar10;
  uint uVar11;
  long *plVar12;
  ulong *puVar13;
  ulong uVar14;
  uint __val;
  void **ppvVar15;
  long lVar16;
  _Alloc_hider _Var17;
  uint __len;
  long lVar18;
  string __str_1;
  string __str;
  string local_d8;
  ModelDescription *local_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  iVar3 = (interface->input_).super_RepeatedPtrFieldBase.current_size_;
  if ((long)iVar3 < 1) {
    if (validationPolicy->allowsEmptyInput != false) {
      if (8 < modelVersion) goto LAB_002ee52c;
      local_50[0] = &local_40;
      std::__cxx11::string::_M_construct((ulong)local_50,'\x01');
      local_50[0]->_M_local_buf[0] = '9';
      plVar9 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x3b901f);
      local_70 = &local_60;
      plVar12 = plVar9 + 2;
      if ((long *)*plVar9 == plVar12) {
        local_60 = *plVar12;
        lStack_58 = plVar9[3];
      }
      else {
        local_60 = *plVar12;
        local_70 = (long *)*plVar9;
      }
      local_68 = plVar9[1];
      *plVar9 = (long)plVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
      puVar13 = (ulong *)(plVar9 + 2);
      if ((ulong *)*plVar9 == puVar13) {
        local_a0 = *puVar13;
        lStack_98 = plVar9[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *puVar13;
        local_b0 = (ulong *)*plVar9;
      }
      local_a8 = plVar9[1];
      *plVar9 = (long)puVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      __val = -modelVersion;
      if (0 < modelVersion) {
        __val = modelVersion;
      }
      __len = 1;
      if (9 < __val) {
        uVar14 = (ulong)__val;
        uVar6 = 4;
        do {
          __len = uVar6;
          uVar11 = (uint)uVar14;
          if (uVar11 < 100) {
            __len = __len - 2;
            goto LAB_002ee865;
          }
          if (uVar11 < 1000) {
            __len = __len - 1;
            goto LAB_002ee865;
          }
          if (uVar11 < 10000) goto LAB_002ee865;
          uVar14 = uVar14 / 10000;
          uVar6 = __len + 4;
        } while (99999 < uVar11);
        __len = __len + 1;
      }
LAB_002ee865:
      local_90 = local_80;
      std::__cxx11::string::_M_construct
                ((ulong)&local_90,(char)__len - (char)(modelVersion >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)((uint)modelVersion >> 0x1f) + (long)local_90),__len,__val);
      uVar14 = 0xf;
      if (local_b0 != &local_a0) {
        uVar14 = local_a0;
      }
      if (uVar14 < (ulong)(local_88 + local_a8)) {
        uVar14 = 0xf;
        if (local_90 != local_80) {
          uVar14 = local_80[0];
        }
        if (uVar14 < (ulong)(local_88 + local_a8)) goto LAB_002ee8d7;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_b0);
      }
      else {
LAB_002ee8d7:
        puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90);
      }
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      psVar2 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar2) {
        local_d8.field_2._M_allocated_capacity = *psVar2;
        local_d8.field_2._8_8_ = puVar10[3];
      }
      else {
        local_d8.field_2._M_allocated_capacity = *psVar2;
        local_d8._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_d8._M_string_length = puVar10[1];
      *puVar10 = psVar2;
      puVar10[1] = 0;
      *(undefined1 *)psVar2 = 0;
      Result::Result(__return_storage_ptr__,INVALID_COMPATIBILITY_VERSION,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if (local_90 != local_80) {
        operator_delete(local_90,local_80[0] + 1);
      }
      if (local_b0 != &local_a0) {
        operator_delete(local_b0,local_a0 + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      _Var17._M_p = (pointer)local_50[0];
      if (local_50[0] == &local_40) {
        return __return_storage_ptr__;
      }
      goto LAB_002ee775;
    }
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"Models must have one or more inputs.","");
    Result::Result(__return_storage_ptr__,MODEL_TYPE_DOES_NOT_SUPPORT_EMPTY_INPUT,&local_d8);
  }
  else {
LAB_002ee52c:
    iVar8 = (interface->output_).super_RepeatedPtrFieldBase.current_size_;
    if (0 < iVar8 || validationPolicy->allowsEmptyOutput != false) {
      pRVar4 = (interface->input_).super_RepeatedPtrFieldBase.rep_;
      ppvVar15 = pRVar4->elements;
      if (pRVar4 == (Rep *)0x0) {
        ppvVar15 = (void **)0x0;
      }
      local_b8 = interface;
      if (iVar3 != 0) {
        paVar1 = &(__return_storage_ptr__->m_message).field_2;
        lVar18 = 0;
        do {
          validateFeatureDescription
                    (__return_storage_ptr__,*(FeatureDescription **)((long)ppvVar15 + lVar18),
                     modelVersion,INPUT);
          bVar7 = Result::good(__return_storage_ptr__);
          if (!bVar7) {
            return __return_storage_ptr__;
          }
          pcVar5 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar5 != paVar1) {
            operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
          }
          lVar18 = lVar18 + 8;
        } while ((long)iVar3 * 8 != lVar18);
        iVar8 = (local_b8->output_).super_RepeatedPtrFieldBase.current_size_;
      }
      pRVar4 = (local_b8->output_).super_RepeatedPtrFieldBase.rep_;
      ppvVar15 = pRVar4->elements;
      if (pRVar4 == (Rep *)0x0) {
        ppvVar15 = (void **)0x0;
      }
      if (iVar8 != 0) {
        paVar1 = &(__return_storage_ptr__->m_message).field_2;
        lVar18 = 0;
        do {
          validateFeatureDescription
                    (__return_storage_ptr__,*(FeatureDescription **)((long)ppvVar15 + lVar18),
                     modelVersion,OUTPUT);
          bVar7 = Result::good(__return_storage_ptr__);
          if (!bVar7) {
            return __return_storage_ptr__;
          }
          pcVar5 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar5 != paVar1) {
            operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
          }
          lVar18 = lVar18 + 8;
        } while ((long)iVar8 * 8 != lVar18);
      }
      pRVar4 = (local_b8->state_).super_RepeatedPtrFieldBase.rep_;
      ppvVar15 = pRVar4->elements;
      if (pRVar4 == (Rep *)0x0) {
        ppvVar15 = (void **)0x0;
      }
      lVar18 = (long)(local_b8->state_).super_RepeatedPtrFieldBase.current_size_;
      if (lVar18 != 0) {
        paVar1 = &(__return_storage_ptr__->m_message).field_2;
        lVar16 = 0;
        do {
          validateFeatureDescription
                    (__return_storage_ptr__,*(FeatureDescription **)((long)ppvVar15 + lVar16),
                     modelVersion,STATE);
          bVar7 = Result::good(__return_storage_ptr__);
          if (!bVar7) {
            return __return_storage_ptr__;
          }
          pcVar5 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar5 != paVar1) {
            operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
          }
          lVar16 = lVar16 + 8;
        } while (lVar18 * 8 != lVar16);
      }
      Result::Result(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"Models must have one or more outputs.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_d8);
  }
  local_40._M_allocated_capacity = local_d8.field_2._M_allocated_capacity;
  _Var17._M_p = local_d8._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
    return __return_storage_ptr__;
  }
LAB_002ee775:
  operator_delete(_Var17._M_p,local_40._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateFeatureDescriptions(const Description& interface, int modelVersion, const ValidationPolicy& validationPolicy) {
        if (interface.input_size() < 1) {
            if (!validationPolicy.allowsEmptyInput) {
                return Result(ResultType::MODEL_TYPE_DOES_NOT_SUPPORT_EMPTY_INPUT, "Models must have one or more inputs.");
            }

            if (modelVersion < MLMODEL_SPECIFICATION_VERSION_IOS18) {
                return  Result(ResultType::INVALID_COMPATIBILITY_VERSION,
                               "Empty input is only valid in specification verison >= " + std::to_string(MLMODEL_SPECIFICATION_VERSION_IOS18)+
                               ". This model has version " + std::to_string(modelVersion));
            }
        }

        if (!validationPolicy.allowsEmptyOutput && interface.output_size() < 1) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, "Models must have one or more outputs.");
        }

        for (const auto& input : interface.input()) {
            Result r = validateFeatureDescription(input, modelVersion, FeatureIOType::INPUT);
            if (!r.good()) { return r; }
        }

        for (const auto& output : interface.output()) {
            Result r = validateFeatureDescription(output, modelVersion, FeatureIOType::OUTPUT);
            if (!r.good()) { return r; }
        }

        for (const auto& state : interface.state()) {
            Result r = validateFeatureDescription(state, modelVersion, FeatureIOType::STATE);
            if (!r.good()) { return r; }
        }

        // If we got here, all inputs/outputs seem good independently of each other.
        return Result();
    }